

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PIT.hpp
# Opt level: O1

uint8_t __thiscall
PCCompatible::i8253<false,_PCCompatible::PITObserver>::read<1>
          (i8253<false,_PCCompatible::PITObserver> *this)

{
  bool bVar1;
  uint16_t uVar2;
  LatchMode LVar3;
  uint8_t uVar4;
  
  LVar3 = this->channels_[1].latch_mode;
  if (LVar3 == HighOnly) {
    return *(uint8_t *)((long)&this->channels_[1].latch + 1);
  }
  if (LVar3 == LowOnly) {
    return (uint8_t)this->channels_[1].latch;
  }
  bVar1 = this->channels_[1].next_access_high;
  uVar2 = this->channels_[1].latch;
  this->channels_[1].next_access_high = (bool)(bVar1 ^ 1);
  uVar4 = (uint8_t)(uVar2 >> 8);
  if (bVar1 == false) {
    uVar4 = (uint8_t)uVar2;
  }
  return uVar4;
}

Assistant:

uint8_t read() {
				switch(latch_mode) {
					case LatchMode::LowOnly:	return uint8_t(latch);
					case LatchMode::HighOnly:	return uint8_t(latch >> 8);
					default:
					case LatchMode::LowHigh:
						next_access_high ^= true;
						return next_access_high ? uint8_t(latch) : uint8_t(latch >> 8);
					break;
				}
			}